

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O1

void __thiscall QPainter::eraseRect(QPainter *this,QRect *rect)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::eraseRect((QRectF *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::eraseRect(const QRect &rect)
{
    eraseRect(QRectF(rect));
}